

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_coords.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ChStreamOutAscii *pCVar1;
  ChCoordsys<double> *pCVar2;
  ChCoordsys<double> *pCVar3;
  double dVar4;
  int i;
  ChTimer<double> timer;
  ChVector<double> pallo;
  ChQuaternion<double> pollo;
  ChFrameMoving<double> bres;
  ChFrameMoving<double> testX;
  ChFrameMoving<double> testPw;
  ChFrameMoving<double> testPl;
  ChVector<double> locacc;
  ChVector<double> locspeed;
  ChVector<double> locpos;
  ChFrameMoving<double> testa;
  ChGwMatrix34<double> Gw;
  ChGlMatrix34<double> Gl;
  ChFmMatrix34<double> Fm;
  ChFpMatrix34<double> Fp;
  ChFrameMoving<double> mresg;
  ChFrame<double> mresf;
  ChFrameMoving<double> mframemovingB1;
  ChFrame<double> mframeA1;
  ChFrame<double> mframeAinv;
  ChCoordsys<double> c_0;
  ChFrame<double> f_0;
  ChFrame<double> f_3;
  ChFrame<double> tempf;
  ChFrame<double> f32;
  ChFrame<double> f21;
  ChFrame<double> f10;
  ChMatrix33<double> m32;
  ChQuaternion<double> q32;
  ChVector<double> v32;
  ChMatrix33<double> m21;
  ChQuaternion<double> q21;
  ChVector<double> v21;
  ChMatrix33<double> m10;
  ChQuaternion<double> q10;
  ChVector<double> v10;
  ChFrame<double> mframeA;
  ChCoordsys<double> csysA;
  ChMatrix33<double> mrotA;
  ChQuaternion<double> qrotA;
  ChVector<double> vtraslA;
  ChVector<double> mvect1;
  ChVector<double> mvect3;
  ChVector<double> mvect2;
  ChVector<double> local_2588;
  ChVector<double> local_2570;
  int local_2554;
  ChTimer<double> local_2550;
  ChVector<double> local_2538;
  ChQuaternion<double> local_2520;
  ChFrameMoving<double> local_2500;
  ChQuaternion<double> local_2408;
  ChVector<double> local_23e8;
  ChFrameMoving<double> local_23d0;
  ChQuaternion<double> local_22d8;
  ChVector<double> local_22b8;
  ChFrameMoving<double> local_22a0;
  ChVector<double> local_21a8;
  ChVector<double> local_2190;
  ChFrameMoving<double> local_2178;
  ChVector<double> local_2080;
  ChVector<double> local_2068;
  ChVector<double> local_2050;
  ChVector<double> local_2038;
  ChVector<double> local_2020;
  ChVector<double> local_2008;
  ChVector<double> local_1ff0;
  ChFrameMoving<double> local_1fd8;
  ChGwMatrix34<double> local_1ee0;
  ChGlMatrix34<double> local_1e80;
  ChFmMatrix34<double> local_1e20;
  ChFpMatrix34<double> local_1dc0;
  ChQuaternion<double> local_1d50;
  ChVector<double> local_1d30;
  ChFrameMoving<double> local_1d18;
  ChFrame<double> local_1c20;
  ChFrameMoving<double> local_1b98;
  ChFrame<double> local_1aa0;
  ChFrame<double> local_1a18;
  ChFrame<double> local_1990;
  ChFrame<double> local_1908;
  ChVector<double> local_1880;
  ChVector<double> local_1868;
  ChVector<double> local_1850;
  ChFrame<double> local_1838;
  ChFrame<double> local_17b0;
  ChFrame<double> local_1728;
  ChVector<double> local_16a0;
  ChFrame<double> local_1688;
  ChFrame<double> local_1600;
  ChFrame<double> local_1578;
  ChFrame<double> local_14f0;
  ChFrame<double> local_1468;
  ChVector<double> local_13e0;
  ChFrame<double> local_13c8;
  ChFrame<double> local_1340;
  ChFrame<double> local_12b8;
  ChVector<double> local_1230;
  ChVector<double> local_1218;
  ChFrame<double> local_1200;
  ChVector<double> local_1178;
  ChFrame<double> local_1160;
  ChVector<double> local_10d8;
  ChFrame<double> local_10c0;
  ChVector<double> local_1038;
  ChVector<double> local_1020;
  ChVector<double> local_1008;
  ChVector<double> local_ff0;
  ChVector<double> local_fd8;
  ChVector<double> local_fc0;
  ChVector<double> local_fa8;
  ChVector<double> local_f90;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_f78;
  ChVector<double> local_f70;
  ChCoordsys<double> local_f58;
  ChCoordsys<double> local_f20;
  ChCoordsys<double> local_ee8;
  ChCoordsys<double> local_eb0;
  ChCoordsys<double> local_e78;
  ChCoordsys<double> local_e40;
  ChCoordsys<double> local_e08;
  ChFrame<double> local_dd0;
  ChFrame<double> local_d48;
  ChFrame<double> local_cc0;
  ChFrame<double> local_c38;
  ChFrame<double> local_bb0;
  ChFrame<double> local_b28;
  ChQuaternion<double> local_aa0;
  ChVector<double> local_a80;
  ChFrame<double> local_a68;
  ChQuaternion<double> local_9e0;
  ChFrame<double> local_9c0;
  ChVector<double> local_938;
  ChFrame<double> local_920;
  ChFrame<double> local_898;
  ChFrame<double> local_810;
  ChFrame<double> local_788;
  ChVector<double> local_700;
  ChVector<double> local_6e8;
  ChVector<double> local_6d0;
  ChVector<double> local_6b8;
  ChFrame<double> local_6a0;
  ChFrame<double> local_618;
  ChFrame<double> local_590;
  ChVector<double> local_508;
  ChVector<double> local_4f0;
  ChVector<double> local_4d8;
  ChVector<double> local_4c0;
  ChVector<double> local_4a8;
  ChVector<double> local_490;
  ChMatrix33<double> local_478;
  ChQuaternion<double> local_430;
  ChVector<double> local_410;
  ChMatrix33<double> local_3f8;
  ChQuaternion<double> local_3b0;
  ChVector<double> local_390;
  ChMatrix33<double> local_378;
  ChQuaternion<double> local_330;
  ChVector<double> local_310;
  ChVector<double> local_2f8;
  ChVector<double> local_2e0;
  ChVector<double> local_2b8;
  ChFrame<double> local_2a0;
  ChVector<double> local_218;
  ChVector<double> local_200;
  ChVector<double> local_1e8;
  ChVector<double> local_1d0;
  ChVector<double> local_1b8;
  ChVector<double> local_1a0;
  ChVector<double> local_188;
  ChVector<double> local_170;
  ChVector<double> local_158;
  ChCoordsys<double> local_140;
  ChMatrix33<double> local_108;
  ChQuaternion<double> local_c0;
  ChVector<double> local_a0;
  ChVector<double> local_88;
  ChVector<double> local_70;
  ChVector<double> local_58;
  int local_34;
  
  local_34 = 0;
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar1,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar1,"\n\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"CHRONO demo about coordinate transformations: \n\n");
  chrono::ChVector<double>::ChVector(&local_58);
  chrono::ChVector<double>::ChVector(&local_70);
  chrono::ChVector<double>::ChVector(&local_88,2.0,3.0,4.0);
  chrono::ChVector<double>::ChVector(&local_a0,5.0,6.0,7.0);
  chrono::ChQuaternion<double>::ChQuaternion(&local_c0,1.0,3.0,4.0,5.0);
  chrono::ChQuaternion<double>::Normalize(&local_c0);
  chrono::ChMatrix33<double>::ChMatrix33(&local_108,&local_c0);
  chrono::ChCoordsys<double>::ChCoordsys(&local_140,&local_a0,&local_c0);
  chrono::ChMatrix33<double>::operator*(&local_170,&local_108,&local_88);
  chrono::ChVector<double>::operator+(&local_158,&local_a0,&local_170);
  chrono::ChVector<double>::operator=(&local_58,&local_158);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_58);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..using linear algebra, \n");
  chrono::ChQuaternion<double>::Rotate(&local_1a0,&local_c0,&local_88);
  chrono::ChVector<double>::operator+(&local_188,&local_a0,&local_1a0);
  chrono::ChVector<double>::operator=(&local_58,&local_188);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_58);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..using quaternion rotation, \n");
  chrono::ChTransform<double>::TransformLocalToParent(&local_1b8,&local_88,&local_a0,&local_108);
  chrono::ChVector<double>::operator=(&local_58,&local_1b8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_58);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..using the ChTransform- vect and rot.matrix, \n");
  chrono::ChTransform<double>::TransformLocalToParent(&local_1d0,&local_88,&local_a0,&local_c0);
  chrono::ChVector<double>::operator=(&local_58,&local_1d0);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_58);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..using the ChTransform- vect and quat, \n");
  chrono::ChCoordsys<double>::TransformLocalToParent(&local_1e8,&local_140,&local_88);
  chrono::ChVector<double>::operator=(&local_58,&local_1e8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_58);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..using a ChChCoordsys<> object, \n");
  chrono::operator>>(&local_200,&local_88,&local_140);
  chrono::ChVector<double>::operator=(&local_58,&local_200);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_58);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..using a ChChCoordsys<> \'>>\' operator, \n");
  chrono::operator*(&local_218,&local_140,&local_88);
  chrono::ChVector<double>::operator=(&local_58,&local_218);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_58);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..using a ChChCoordsys<> \'*\' operator, \n");
  chrono::ChFrame<double>::ChFrame(&local_2a0,&local_a0,&local_c0);
  chrono::ChFrame<double>::TransformLocalToParent(&local_2b8,&local_2a0,&local_88);
  chrono::ChVector<double>::operator=(&local_58,&local_2b8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_58);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..using a ChFrame object function, \n");
  chrono::operator>>(&local_2e0,&local_88,&local_2a0);
  chrono::ChVector<double>::operator=(&local_58,&local_2e0);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_58);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..using a ChFrame \'>>\' operator, \n");
  chrono::ChFrame<double>::operator*(&local_2f8,&local_2a0,&local_88);
  chrono::ChVector<double>::operator=(&local_58,&local_2f8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_58);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..using a ChFrame \'*\' operator, \n");
  chrono::ChVector<double>::ChVector(&local_310,5.0,6.0,7.0);
  chrono::ChQuaternion<double>::ChQuaternion(&local_330,1.0,3.0,4.0,5.0);
  chrono::ChQuaternion<double>::Normalize(&local_330);
  chrono::ChMatrix33<double>::ChMatrix33(&local_378,&local_330);
  chrono::ChVector<double>::ChVector(&local_390,4.0,1.0,3.0);
  chrono::ChQuaternion<double>::ChQuaternion(&local_3b0,3.0,2.0,1.0,5.0);
  chrono::ChQuaternion<double>::Normalize(&local_3b0);
  chrono::ChMatrix33<double>::ChMatrix33(&local_3f8,&local_3b0);
  chrono::ChVector<double>::ChVector(&local_410,1.0,5.0,1.0);
  chrono::ChQuaternion<double>::ChQuaternion(&local_430,4.0,1.0,3.0,1.0);
  chrono::ChQuaternion<double>::Normalize(&local_430);
  chrono::ChMatrix33<double>::ChMatrix33(&local_478,&local_430);
  chrono::ChMatrix33<double>::operator*(&local_508,&local_478,&local_88);
  chrono::ChVector<double>::operator+(&local_4f0,&local_410,&local_508);
  chrono::ChMatrix33<double>::operator*(&local_4d8,&local_3f8,&local_4f0);
  chrono::ChVector<double>::operator+(&local_4c0,&local_390,&local_4d8);
  chrono::ChMatrix33<double>::operator*(&local_4a8,&local_378,&local_4c0);
  chrono::ChVector<double>::operator+(&local_490,&local_310,&local_4a8);
  chrono::ChVector<double>::operator=(&local_70,&local_490);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_70);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..triple trsf. using linear algebra, \n");
  chrono::ChFrame<double>::ChFrame(&local_590,&local_310,&local_330);
  chrono::ChFrame<double>::ChFrame(&local_618,&local_390,&local_3b0);
  chrono::ChFrame<double>::ChFrame(&local_6a0,&local_410,&local_430);
  chrono::operator>>(&local_6e8,&local_88,&local_6a0);
  chrono::operator>>(&local_6d0,&local_6e8,&local_618);
  chrono::operator>>(&local_6b8,&local_6d0,&local_590);
  chrono::ChVector<double>::operator=(&local_70,&local_6b8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_70);
  chrono::ChStreamOutAscii::operator<<
            (pCVar1," ..triple vector trsf. with ChFrame \'>>\' operator, \n");
  chrono::ChFrame<double>::operator*(&local_810,&local_590,&local_618);
  chrono::ChFrame<double>::operator*(&local_788,&local_810,&local_6a0);
  chrono::ChFrame<double>::operator*(&local_700,&local_788,&local_88);
  chrono::ChVector<double>::operator=(&local_70,&local_700);
  chrono::ChFrame<double>::~ChFrame(&local_788);
  chrono::ChFrame<double>::~ChFrame(&local_810);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_70);
  chrono::ChStreamOutAscii::operator<<
            (pCVar1," ..triple vector trsf. with ChFrame \'*\' operator, \n");
  chrono::ChFrame<double>::operator*(&local_920,&local_590,&local_618);
  chrono::ChFrame<double>::operator*(&local_898,&local_920,&local_6a0);
  chrono::ChFrame<double>::~ChFrame(&local_920);
  chrono::ChFrame<double>::operator*(&local_938,&local_898,&local_88);
  chrono::ChVector<double>::operator=(&local_70,&local_938);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_70);
  chrono::ChStreamOutAscii::operator<<
            (pCVar1," ..triple vector trsf. with ChFrame \'*\' operator, \n");
  chrono::ChQuaternion<double>::ChQuaternion(&local_9e0,1.0,0.0,0.0,0.0);
  chrono::ChFrame<double>::ChFrame(&local_9c0,&local_88,&local_9e0);
  chrono::ChVector<double>::ChVector(&local_a80,0.0,0.0,0.0);
  chrono::ChQuaternion<double>::ChQuaternion(&local_aa0,1.0,0.0,0.0,0.0);
  chrono::ChFrame<double>::ChFrame(&local_a68,&local_a80,&local_aa0);
  chrono::ChFrame<double>::operator>>(&local_c38,&local_9c0,&local_6a0);
  chrono::ChFrame<double>::operator>>(&local_bb0,&local_c38,&local_618);
  chrono::ChFrame<double>::operator>>(&local_b28,&local_bb0,&local_590);
  chrono::ChFrame<double>::operator=(&local_a68,&local_b28);
  chrono::ChFrame<double>::~ChFrame(&local_b28);
  chrono::ChFrame<double>::~ChFrame(&local_bb0);
  chrono::ChFrame<double>::~ChFrame(&local_c38);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_a68);
  chrono::ChStreamOutAscii::operator<<
            (pCVar1," ..triple frame trsf. with ChFrame \'>>\' operator,  \n");
  chrono::ChFrame<double>::operator*(&local_dd0,&local_590,&local_618);
  chrono::ChFrame<double>::operator*(&local_d48,&local_dd0,&local_6a0);
  chrono::ChFrame<double>::operator*(&local_cc0,&local_d48,&local_9c0);
  chrono::ChFrame<double>::operator=(&local_a68,&local_cc0);
  chrono::ChFrame<double>::~ChFrame(&local_cc0);
  chrono::ChFrame<double>::~ChFrame(&local_d48);
  chrono::ChFrame<double>::~ChFrame(&local_dd0);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_a68);
  chrono::ChStreamOutAscii::operator<<
            (pCVar1," ..triple frame trsf. with ChFrame \'*\' operator,  \n");
  chrono::ChCoordsys<double>::ChCoordsys(&local_e08);
  pCVar2 = chrono::ChFrame<double>::GetCoord(&local_9c0);
  pCVar3 = chrono::ChFrame<double>::GetCoord(&local_6a0);
  chrono::ChCoordsys<double>::operator>>(&local_eb0,pCVar2,pCVar3);
  pCVar2 = chrono::ChFrame<double>::GetCoord(&local_618);
  chrono::ChCoordsys<double>::operator>>(&local_e78,&local_eb0,pCVar2);
  pCVar2 = chrono::ChFrame<double>::GetCoord(&local_590);
  chrono::ChCoordsys<double>::operator>>(&local_e40,&local_e78,pCVar2);
  chrono::ChCoordsys<double>::operator=(&local_e08,&local_e40);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_a68);
  chrono::ChStreamOutAscii::operator<<
            (pCVar1," ..triple frame trsf. with ChCoordsys \'>>\' operator,  \n");
  pCVar2 = chrono::ChFrame<double>::GetCoord(&local_590);
  pCVar3 = chrono::ChFrame<double>::GetCoord(&local_618);
  chrono::ChCoordsys<double>::operator*(&local_f58,pCVar2,pCVar3);
  pCVar2 = chrono::ChFrame<double>::GetCoord(&local_6a0);
  chrono::ChCoordsys<double>::operator*(&local_f20,&local_f58,pCVar2);
  pCVar2 = chrono::ChFrame<double>::GetCoord(&local_9c0);
  chrono::ChCoordsys<double>::operator*(&local_ee8,&local_f20,pCVar2);
  chrono::ChCoordsys<double>::operator=(&local_e08,&local_ee8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_a68);
  chrono::ChStreamOutAscii::operator<<
            (pCVar1," ..triple frame trsf. with ChCoordsys \'*\' operator,  \n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..mvect1 \n");
  local_f78.m_matrix =
       (non_const_type)
       Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::transpose
                 ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_108);
  chrono::ChVector<double>::operator-(&local_f90,&local_58,&local_a0);
  chrono::operator*(&local_f70,&local_f78,&local_f90);
  chrono::ChVector<double>::operator=(&local_88,&local_f70);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..inv, using linear algebra, \n");
  chrono::ChVector<double>::operator-(&local_fc0,&local_58,&local_a0);
  chrono::ChQuaternion<double>::RotateBack(&local_fa8,&local_c0,&local_fc0);
  chrono::ChVector<double>::operator=(&local_88,&local_fa8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..inv, using quaternion rotation, \n");
  chrono::ChTransform<double>::TransformParentToLocal(&local_fd8,&local_58,&local_a0,&local_108);
  chrono::ChVector<double>::operator=(&local_88,&local_fd8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<
            (pCVar1," ..inv, using the ChTransform- vect and rot.matrix, \n");
  chrono::ChTransform<double>::TransformParentToLocal(&local_ff0,&local_58,&local_a0,&local_c0);
  chrono::ChVector<double>::operator=(&local_88,&local_ff0);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..inv, using the ChTransform- vect and quat, \n");
  chrono::ChCoordsys<double>::TransformParentToLocal(&local_1008,&local_140,&local_58);
  chrono::ChVector<double>::operator=(&local_88,&local_1008);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..inv, using a ChChCoordsys<> object, \n");
  chrono::ChFrame<double>::TransformParentToLocal(&local_1020,&local_2a0,&local_58);
  chrono::ChVector<double>::operator=(&local_88,&local_1020);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..inv, using a ChFrame object function, \n");
  chrono::ChFrame<double>::GetInverse(&local_10c0,&local_2a0);
  chrono::operator>>(&local_1038,&local_58,&local_10c0);
  chrono::ChVector<double>::operator=(&local_88,&local_1038);
  chrono::ChFrame<double>::~ChFrame(&local_10c0);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<
            (pCVar1," ..inv, using a ChFrame inverse and \'>>\' operator, \n");
  chrono::ChFrame<double>::GetInverse(&local_1160,&local_2a0);
  chrono::ChFrame<double>::operator*(&local_10d8,&local_1160,&local_58);
  chrono::ChVector<double>::operator=(&local_88,&local_10d8);
  chrono::ChFrame<double>::~ChFrame(&local_1160);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<
            (pCVar1," ..inv, using a ChFrame inverse and  \'*\' operator, \n");
  chrono::ChFrame<double>::operator/(&local_1178,&local_2a0,&local_58);
  chrono::ChVector<double>::operator=(&local_88,&local_1178);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..inv, using a ChFrame \'/\' operator, \n");
  chrono::ChFrame<double>::ChFrame(&local_1200,&local_2a0);
  chrono::ChFrame<double>::Invert(&local_1200);
  chrono::ChFrame<double>::operator*(&local_1218,&local_1200,&local_58);
  chrono::ChVector<double>::operator=(&local_88,&local_1218);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..inv, using an inverted ChFrame \n");
  chrono::ChFrame<double>::operator*(&local_13c8,&local_590,&local_618);
  chrono::ChFrame<double>::operator*(&local_1340,&local_13c8,&local_6a0);
  chrono::ChFrame<double>::GetInverse(&local_12b8,&local_1340);
  chrono::ChFrame<double>::operator*(&local_1230,&local_12b8,&local_70);
  chrono::ChVector<double>::operator=(&local_88,&local_1230);
  chrono::ChFrame<double>::~ChFrame(&local_12b8);
  chrono::ChFrame<double>::~ChFrame(&local_1340);
  chrono::ChFrame<double>::~ChFrame(&local_13c8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..inv three transf \n");
  chrono::ChFrame<double>::GetInverse(&local_1578,&local_6a0);
  chrono::ChFrame<double>::GetInverse(&local_1600,&local_618);
  chrono::ChFrame<double>::operator*(&local_14f0,&local_1578,&local_1600);
  chrono::ChFrame<double>::GetInverse(&local_1688,&local_590);
  chrono::ChFrame<double>::operator*(&local_1468,&local_14f0,&local_1688);
  chrono::ChFrame<double>::operator*(&local_13e0,&local_1468,&local_70);
  chrono::ChVector<double>::operator=(&local_88,&local_13e0);
  chrono::ChFrame<double>::~ChFrame(&local_1468);
  chrono::ChFrame<double>::~ChFrame(&local_1688);
  chrono::ChFrame<double>::~ChFrame(&local_14f0);
  chrono::ChFrame<double>::~ChFrame(&local_1600);
  chrono::ChFrame<double>::~ChFrame(&local_1578);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..inv three transf (another method) \n");
  chrono::ChFrame<double>::operator>>(&local_1838,&local_6a0,&local_618);
  chrono::ChFrame<double>::operator>>(&local_17b0,&local_1838,&local_590);
  chrono::ChFrame<double>::GetInverse(&local_1728,&local_17b0);
  chrono::operator>>(&local_16a0,&local_70,&local_1728);
  chrono::ChVector<double>::operator=(&local_88,&local_16a0);
  chrono::ChFrame<double>::~ChFrame(&local_1728);
  chrono::ChFrame<double>::~ChFrame(&local_17b0);
  chrono::ChFrame<double>::~ChFrame(&local_1838);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..inv three transf (another method) \n");
  chrono::ChFrame<double>::GetInverse(&local_1908,&local_590);
  chrono::operator>>(&local_1880,&local_70,&local_1908);
  chrono::ChFrame<double>::GetInverse(&local_1990,&local_618);
  chrono::operator>>(&local_1868,&local_1880,&local_1990);
  chrono::ChFrame<double>::GetInverse(&local_1a18,&local_6a0);
  chrono::operator>>(&local_1850,&local_1868,&local_1a18);
  chrono::ChVector<double>::operator=(&local_88,&local_1850);
  chrono::ChFrame<double>::~ChFrame(&local_1a18);
  chrono::ChFrame<double>::~ChFrame(&local_1990);
  chrono::ChFrame<double>::~ChFrame(&local_1908);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_88);
  chrono::ChStreamOutAscii::operator<<(pCVar1," ..inv three transf (another method) \n");
  chrono::ChFrame<double>::ChFrame(&local_1aa0,&local_a0,&local_c0);
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_1b98,&local_a0,&local_c0);
  chrono::operator*(&local_1c20,&local_1b98,&local_1aa0);
  chrono::operator*(&local_1d18,&local_1aa0,&local_1b98);
  chrono::ChFrame<double>::operator>>=(&local_1aa0,&local_590);
  chrono::ChVector<double>::ChVector(&local_1d30,1.0,2.0,3.0);
  chrono::ChFrame<double>::operator>>=(&local_1aa0,&local_1d30);
  chrono::Q_from_AngAxis(0.5235987755982988,(ChVector *)&local_1d50);
  chrono::ChFrame<double>::operator>>=(&local_1aa0,&local_1d50);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1," %%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%% \n\n");
  chrono::ChMatrix33<double>::Set_A_quaternion(&local_108,&local_c0);
  chrono::ChFpMatrix34<double>::ChFpMatrix34(&local_1dc0,&local_c0);
  chrono::ChFmMatrix34<double>::ChFmMatrix34(&local_1e20,&local_c0);
  chrono::ChGlMatrix34<double>::ChGlMatrix34(&local_1e80,&local_c0);
  chrono::ChGwMatrix34<double>::ChGwMatrix34(&local_1ee0,&local_c0);
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_1fd8,&local_a0,&local_c0);
  chrono::ChVector<double>::ChVector(&local_1ff0,0.5,0.6,0.7);
  chrono::ChFrameMoving<double>::SetPos_dt(&local_1fd8,&local_1ff0);
  chrono::ChVector<double>::ChVector(&local_2008,1.1,2.1,5.1);
  chrono::ChFrameMoving<double>::SetWvel_loc(&local_1fd8,&local_2008);
  chrono::ChVector<double>::ChVector(&local_2020,7.0,8.0,9.0);
  chrono::ChFrameMoving<double>::SetPos_dtdt(&local_1fd8,&local_2020);
  chrono::ChVector<double>::ChVector(&local_2038,4.3,5.3,2.3);
  chrono::ChFrameMoving<double>::SetWacc_loc(&local_1fd8,&local_2038);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_1fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"a moving frame");
  chrono::ChVector<double>::ChVector(&local_2050,0.1,3.1,1.1);
  chrono::ChVector<double>::ChVector(&local_2068,3.2,9.2,7.2);
  chrono::ChVector<double>::ChVector(&local_2080,5.3,3.3,2.3);
  chrono::ChFrameMoving<double>::ChFrameMoving
            (&local_2178,&local_2050,(ChQuaternion<double> *)&chrono::QUNIT);
  chrono::ChFrameMoving<double>::SetPos_dt(&local_2178,&local_2068);
  chrono::ChFrameMoving<double>::SetRot_dt(&local_2178,&local_c0);
  chrono::ChVector<double>::ChVector(&local_2190,0.4,0.5,0.6);
  chrono::ChFrameMoving<double>::SetWvel_loc(&local_2178,&local_2190);
  chrono::ChFrameMoving<double>::SetPos_dtdt(&local_2178,&local_2080);
  chrono::ChVector<double>::ChVector(&local_21a8,0.43,0.53,0.63);
  chrono::ChFrameMoving<double>::SetWacc_loc(&local_2178,&local_21a8);
  chrono::ChVector<double>::ChVector(&local_22b8,0.0,0.0,0.0);
  chrono::ChQuaternion<double>::ChQuaternion(&local_22d8,1.0,0.0,0.0,0.0);
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_22a0,&local_22b8,&local_22d8);
  chrono::ChVector<double>::ChVector(&local_23e8,0.0,0.0,0.0);
  chrono::ChQuaternion<double>::ChQuaternion(&local_2408,1.0,0.0,0.0,0.0);
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_23d0,&local_23e8,&local_2408);
  chrono::ChFrameMoving<double>::TransformLocalToParent(&local_1fd8,&local_2178,&local_22a0);
  chrono::ChFrameMoving<double>::operator>>(&local_2500,&local_2178,&local_1fd8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,&local_2500);
  chrono::ChStreamOutAscii::operator<<(pCVar1," trasf loc->abs \n");
  chrono::ChQuaternion<double>::ChQuaternion(&local_2520,3.0,5.0,6.0,7.0);
  chrono::ChVector<double>::ChVector(&local_2538,2.0,4.0,6.0);
  chrono::ChTimer<double>::ChTimer(&local_2550);
  chrono::ChTimer<double>::start(&local_2550);
  for (local_2554 = 0; local_2554 < 1000000; local_2554 = local_2554 + 1) {
    chrono::ChFrameMoving<double>::TransformLocalToParent(&local_1fd8,&local_2178,&local_22a0);
  }
  chrono::ChTimer<double>::stop(&local_2550);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar1,"TEST 10e6 of ChFrameMoving::TransformLocalToParent (1.38) Time: ");
  dVar4 = chrono::ChTimer<double>::operator()(&local_2550);
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,dVar4);
  chrono::ChStreamOutAscii::operator<<(pCVar1," \n");
  chrono::ChTimer<double>::start(&local_2550);
  for (local_2554 = 0; local_2554 < 1000000; local_2554 = local_2554 + 1) {
    chrono::operator>>(&local_2570,&local_88,&local_2a0);
    chrono::ChVector<double>::operator=(&local_58,&local_2570);
  }
  chrono::ChTimer<double>::stop(&local_2550);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar1,"TEST 10e6 of mvect2 = mvect1 >> mframeA; (0.03)");
  dVar4 = chrono::ChTimer<double>::operator()(&local_2550);
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,dVar4);
  chrono::ChStreamOutAscii::operator<<(pCVar1," \n");
  chrono::ChTimer<double>::start(&local_2550);
  for (local_2554 = 0; local_2554 < 1000000; local_2554 = local_2554 + 1) {
    chrono::ChFrameMoving<double>::PointAccelerationParentToLocal
              (&local_2588,&local_1fd8,&local_a0,&local_a0,&local_a0);
  }
  chrono::ChTimer<double>::stop(&local_2550);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar1,"TEST 10e6 of PointAccelerationParentToLocal (0.811)");
  dVar4 = chrono::ChTimer<double>::operator()(&local_2550);
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,dVar4);
  chrono::ChStreamOutAscii::operator<<(pCVar1," \n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"\n  CHRONO execution terminated.");
  local_34 = 0;
  chrono::ChFrameMoving<double>::~ChFrameMoving(&local_2500);
  chrono::ChFrameMoving<double>::~ChFrameMoving(&local_23d0);
  chrono::ChFrameMoving<double>::~ChFrameMoving(&local_22a0);
  chrono::ChFrameMoving<double>::~ChFrameMoving(&local_2178);
  chrono::ChFrameMoving<double>::~ChFrameMoving(&local_1fd8);
  chrono::ChFrameMoving<double>::~ChFrameMoving(&local_1d18);
  chrono::ChFrame<double>::~ChFrame(&local_1c20);
  chrono::ChFrameMoving<double>::~ChFrameMoving(&local_1b98);
  chrono::ChFrame<double>::~ChFrame(&local_1aa0);
  chrono::ChFrame<double>::~ChFrame(&local_1200);
  chrono::ChFrame<double>::~ChFrame(&local_a68);
  chrono::ChFrame<double>::~ChFrame(&local_9c0);
  chrono::ChFrame<double>::~ChFrame(&local_898);
  chrono::ChFrame<double>::~ChFrame(&local_6a0);
  chrono::ChFrame<double>::~ChFrame(&local_618);
  chrono::ChFrame<double>::~ChFrame(&local_590);
  chrono::ChFrame<double>::~ChFrame(&local_2a0);
  return local_34;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    // To write something to the console, use the chrono::GetLog()
    GetLog() << "CHRONO demo about coordinate transformations: \n\n";

    //
    // Some methods to achieve coordinate transformations, and some
    // examples of how to manipulate coordinates and frames, using Chrono features.
    //
    // You can use ChTransform or ChChCoordsys<> or ChFrame functions to transform points
    // from/to local coordinates in 3D, in ascending complexity and capabilities.
    //

    ChVector<> mvect2;  // resulting (transformed) vectors will go here
    ChVector<> mvect3;

    // Define a  POINT  to be transformed, expressed in
    // local frame coordinate.
    ChVector<> mvect1(2, 3, 4);

    // Define a vector representing the TRANSLATION of the frame
    // respect to absolute (world) coordinates.
    ChVector<> vtraslA(5, 6, 7);

    // Define a quaternion representing the ROTATION of the frame
    // respect to absolute (world) coordinates. Must be normalized.
    ChQuaternion<> qrotA(1, 3, 4, 5);
    qrotA.Normalize();

    // ..Also create a 3x3 rotation matrix [A] from the quaternion
    // (at any time you can use mrotA.Set_A_quaternion(qrotA) );
    ChMatrix33<> mrotA(qrotA);

    // ..Also create a ChCoordsys<>tem object, representing both
    // translation and rotation.
    ChCoordsys<> csysA(vtraslA, qrotA);

    // OK!!! Now we are ready to perform the transformation, like in
    // linear algebra formula v'=t+[A]*v, so that we will obtain
    // the coordinates of mvect1 in absolute coordinates.
    // This can be achieved in many ways. Let's see them.

    // TRANSFORM USING ROTATION MATRIX AND LINEAR ALGEBRA
    //
    mvect2 = vtraslA + mrotA * mvect1;  // like:  v2 = t + [A]*v1
    GetLog() << mvect2 << " ..using linear algebra, \n";

    // TRANSFORM USING QUATERNION ROTATION

    mvect2 = vtraslA + qrotA.Rotate(mvect1);
    GetLog() << mvect2 << " ..using quaternion rotation, \n";

    // TRANSFORM USING THE ChTransform STATIC METHODS

    mvect2 = ChTransform<>::TransformLocalToParent(mvect1, vtraslA, mrotA);
    GetLog() << mvect2 << " ..using the ChTransform- vect and rot.matrix, \n";

    mvect2 = ChTransform<>::TransformLocalToParent(mvect1, vtraslA, qrotA);
    GetLog() << mvect2 << " ..using the ChTransform- vect and quat, \n";

    // TRANSFORM USING A ChCoordys OBJECT

    mvect2 = csysA.TransformLocalToParent(mvect1);
    GetLog() << mvect2 << " ..using a ChChCoordsys<> object, \n";

    mvect2 = mvect1 >> csysA;
    GetLog() << mvect2 << " ..using a ChChCoordsys<> '>>' operator, \n";

    mvect2 = csysA * mvect1;
    GetLog() << mvect2 << " ..using a ChChCoordsys<> '*' operator, \n";

    // TRANSFORM USING A ChFrame OBJECT

    ChFrame<> mframeA(vtraslA, qrotA);  // or ChFrame<> mframeA(csysA);

    mvect2 = mframeA.TransformLocalToParent(mvect1);
    GetLog() << mvect2 << " ..using a ChFrame object function, \n";

    mvect2 = mvect1 >> mframeA;
    GetLog() << mvect2 << " ..using a ChFrame '>>' operator, \n";

    mvect2 = mframeA * mvect1;
    GetLog() << mvect2 << " ..using a ChFrame '*' operator, \n";

    //
    // Now perform transformations in a chain of frames, in
    // sequence.
    //

    ChVector<> v10(5, 6, 7);
    ChQuaternion<> q10(1, 3, 4, 5);
    q10.Normalize();
    ChMatrix33<> m10(q10);

    ChVector<> v21(4, 1, 3);
    ChQuaternion<> q21(3, 2, 1, 5);
    q21.Normalize();
    ChMatrix33<> m21(q21);

    ChVector<> v32(1, 5, 1);
    ChQuaternion<> q32(4, 1, 3, 1);
    q32.Normalize();
    ChMatrix33<> m32(q32);

    // ...with linear algebra:

    mvect3 = v10 + m10 * (v21 + m21 * (v32 + m32 * mvect1));
    GetLog() << mvect3 << " ..triple trsf. using linear algebra, \n";

    // ...with ChFrame '>>' operator or "*" operator
    // is by far much simplier!

    ChFrame<> f10(v10, q10);
    ChFrame<> f21(v21, q21);
    ChFrame<> f32(v32, q32);

    mvect3 = mvect1 >> f32 >> f21 >> f10;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '>>' operator, \n";

    mvect3 = f10 * f21 * f32 * mvect1;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '*' operator, \n";

    ChFrame<> tempf(f10 * f21 * f32);
    mvect3 = tempf * mvect1;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '*' operator, \n";

    // Not only vectors, but also ChFrame can be transformed
    // with ">>" or "*" operators.

    ChFrame<> f_3(mvect1);
    ChFrame<> f_0;
    f_0 = f_3 >> f32 >> f21 >> f10;
    GetLog() << f_0 << " ..triple frame trsf. with ChFrame '>>' operator,  \n";

    f_0 = f10 * f21 * f32 * f_3;
    GetLog() << f_0 << " ..triple frame trsf. with ChFrame '*' operator,  \n";

    // Test the  ">>" or "*" operators also for ChCoordsys:
    ChCoordsys<> c_0;
    c_0 = f_3.GetCoord() >> f32.GetCoord() >> f21.GetCoord() >> f10.GetCoord();
    GetLog() << f_0 << " ..triple frame trsf. with ChCoordsys '>>' operator,  \n";

    c_0 = f10.GetCoord() * f21.GetCoord() * f32.GetCoord() * f_3.GetCoord();
    GetLog() << f_0 << " ..triple frame trsf. with ChCoordsys '*' operator,  \n";

    //
    // Now test inverse transformations too.
    //
    // From the low-level to the higher level methods, here are some
    // ways to accomplish this.
    //

    // TRANSFORM USING ROTATION MATRIX AND LINEAR ALGEBRA
    //

    GetLog() << mvect1 << " ..mvect1 \n";
    mvect1 = mrotA.transpose() * (mvect2 - vtraslA);  // like:  v1 = [A]'*(v2-t)
    GetLog() << mvect1 << " ..inv, using linear algebra, \n";

    // TRANSFORM USING QUATERNION ROTATION

    mvect1 = qrotA.RotateBack(mvect2 - vtraslA);
    GetLog() << mvect1 << " ..inv, using quaternion rotation, \n";

    // TRANSFORM USING THE ChTransform STATIC METHODS

    mvect1 = ChTransform<>::TransformParentToLocal(mvect2, vtraslA, mrotA);
    GetLog() << mvect1 << " ..inv, using the ChTransform- vect and rot.matrix, \n";

    mvect1 = ChTransform<>::TransformParentToLocal(mvect2, vtraslA, qrotA);
    GetLog() << mvect1 << " ..inv, using the ChTransform- vect and quat, \n";

    // TRANSFORM USING A ChCoordys OBJECT

    mvect1 = csysA.TransformParentToLocal(mvect2);
    GetLog() << mvect1 << " ..inv, using a ChChCoordsys<> object, \n";

    // TRANSFORM USING A ChFrame OBJECT

    mvect1 = mframeA.TransformParentToLocal(mvect2);
    GetLog() << mvect1 << " ..inv, using a ChFrame object function, \n";

    mvect1 = mvect2 >> mframeA.GetInverse();
    GetLog() << mvect1 << " ..inv, using a ChFrame inverse and '>>' operator, \n";

    mvect1 = mframeA.GetInverse() * mvect2;
    GetLog() << mvect1 << " ..inv, using a ChFrame inverse and  '*' operator, \n";

    mvect1 = mframeA / mvect2;
    GetLog() << mvect1 << " ..inv, using a ChFrame '/' operator, \n";

    ChFrame<> mframeAinv(mframeA);
    mframeAinv.Invert();
    mvect1 = mframeAinv * mvect2;
    GetLog() << mvect1 << " ..inv, using an inverted ChFrame \n";

    // ... also for inverting chain of transformations...

    // mvect3 =  f10 * f21 * f32 * mvect1;				// direct transf..

    mvect1 = (f10 * f21 * f32).GetInverse() * mvect3;  // inverse transf.
    GetLog() << mvect1 << " ..inv three transf \n";

    mvect1 = f32.GetInverse() * f21.GetInverse() * f10.GetInverse() * mvect3;
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    mvect1 = mvect3 >> (f32 >> f21 >> f10).GetInverse();
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    mvect1 = mvect3 >> f10.GetInverse() >> f21.GetInverse() >> f32.GetInverse();
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    //
    // Now test the * and >> operators with some mixed-types operators
    //

    ChFrame<> mframeA1(vtraslA, qrotA);
    ChFrameMoving<> mframemovingB1(vtraslA, qrotA);
    ChFrame<> mresf = mframemovingB1 * mframeA1;
    ChFrameMoving<> mresg = mframeA1 * mframemovingB1;

    //
    // Test some in-place operators, even with mixed-types. Some examples.
    //

    // Transform mframeA1 by rotating & translating by another frame,
    // using the in-place >>= operator, as in  A >>= B,
    // that means:   frameA' = frameA >> frameB  = frameB * frameA
    mframeA1 >>= f10;

    // Transform mframeA1 by translating by a vector:
    mframeA1 >>= ChVector<>(1, 2, 3);

    // Transform mframeA1 by rotating it 30 degrees on axis Y, using a quaternion:
    mframeA1 >>= Q_from_AngAxis(30 * CH_C_DEG_TO_RAD, VECT_Y);

    //
    // BENCHMARK FOR EXECUTION SPEED
    //

    GetLog() << " %%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%% \n\n";

    mrotA.Set_A_quaternion(qrotA);
    ChFpMatrix34<> Fp(qrotA);
    ChFmMatrix34<> Fm(qrotA);
    ChGlMatrix34<> Gl(qrotA);
    ChGwMatrix34<> Gw(qrotA);

    ChFrameMoving<> testa(vtraslA, qrotA);
    testa.SetPos_dt(ChVector<>(0.5, 0.6, 0.7));
    testa.SetWvel_loc(ChVector<>(1.1, 2.1, 5.1));
    testa.SetPos_dtdt(ChVector<>(7, 8, 9));
    testa.SetWacc_loc(ChVector<>(4.3, 5.3, 2.3));
    GetLog() << testa << "a moving frame";

    ChVector<> locpos(0.1, 3.1, 1.1);
    ChVector<> locspeed(3.2, 9.2, 7.2);
    ChVector<> locacc(5.3, 3.3, 2.3);

    ChFrameMoving<> testPl(locpos, QUNIT);
    testPl.SetPos_dt(locspeed);
    testPl.SetRot_dt(qrotA);
    testPl.SetWvel_loc(ChVector<>(0.4, 0.5, 0.6));
    testPl.SetPos_dtdt(locacc);
    testPl.SetWacc_loc(ChVector<>(0.43, 0.53, 0.63));
    ChFrameMoving<> testPw;
    ChFrameMoving<> testX;
    testa.TransformLocalToParent(testPl, testPw);

    ChFrameMoving<> bres = (testPl >> testa);

    GetLog() << bres << " trasf loc->abs \n";

    ChQuaternion<> pollo(3, 5, 6, 7);
    ChVector<> pallo(2, 4, 6);

    ChTimer<double> timer;

    //int numcycles = 100000;
    int i;

    timer.start();
    for (i = 0; i < 1000000; i++) {
        testa.TransformLocalToParent(testPl, testPw);
    }
    timer.stop();
    GetLog() << "TEST 10e6 of ChFrameMoving::TransformLocalToParent (1.38) Time: " << timer() << " \n";
    // VC6   : 1.380
    // VC2003: 0.861
    // VC2005: 0.691
    // GCC   : 0.661

    timer.start();
    for (i = 0; i < 1000000; i++) {
        mvect2 = mvect1 >> mframeA;
    }
    timer.stop();
    GetLog() << "TEST 10e6 of mvect2 = mvect1 >> mframeA; (0.03)" << timer() << " \n";
    // VC6   : 0.03
    // VC2003: 0.03
    // VC2005: 0.03
    // GCC   : 0.03

    timer.start();
    for (i = 0; i < 1000000; i++) {
        testa.PointAccelerationParentToLocal(vtraslA, vtraslA, vtraslA);
    }
    timer.stop();
    GetLog() << "TEST 10e6 of PointAccelerationParentToLocal (0.811)" << timer() << " \n";
    // VC6   : 0.811
    // VC2003: 0.531
    // VC2005: 0.410
    // GCC   : 0.320

    /*
       timer.start();
       for (i= 0; i<numcycles; i++)
       {
           for (int j = 0; j<100; j++)
           {
               mvect2 = mvect1 >> f32 >> f21 >> f10;
               // NOTE: thank to the fact that operators are executed from left to
               // right, the above is MUCH faster (16x) than the equivalent:
               //    mvect2 =  f10 * f21 * f32 * mvect1;
               // because the latter, if no parenthesis are used, would imply
               // three expensive frame*frame operations, and a last frame*vector.
           }
       }
       timer.stop();
       GetLog() << "Test 3 frame transf. with >> ChFrame operator: " <<  timer() << " \n";


       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetCoord(vtraslA,qrotA);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetPos() " <<  timer() << " \n";


   //ChQuaternion<> mqdt(1, 2, 3, 4);
       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetRot_dt(mqdt);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetRot_dt() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetRot_dtdt(mqdt);
       }
       timer.stop()
       GetLog() << "Test ChFrame::SetRot_dtdt() " <<  timer() << " \n";


   ChVector<> mv(1, 2, 3);
       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetWvel_loc(mv);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetWvel_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetWacc_loc(mv);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetWacc_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           Vector p= testa.GetWvel_loc();
       }
       timer.stop();
       GetLog() << "Test ChFrame::GetWvel_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           ChVector<> p= testa.GetWacc_loc();
       }
       timer.stop();
       GetLog() << "Test ChFrame::GetWacc_loc() " <<  timer() << " \n";


   */

    GetLog() << "\n  CHRONO execution terminated.";

    return 0;
}